

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O2

void __thiscall
DestListEntryArray::fillDestListEntryArray
          (DestListEntryArray *this,ReadStream *rs,int readFrom,DestListHeader *header)

{
  uchar *__last;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  DestListEntryArray *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entryStringData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> firstPartOfEntry;
  DestListEntry tmpDestListEntry;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  DestListEntry local_198;
  
  uVar3 = DestListHeader::getTotalNumberOfCurrentEntries(header);
  do {
    if ((int)uVar3 < 1) {
      return;
    }
    memset(&local_198,0,0x168);
    ReadStream::read((ReadStream *)local_1c8,(int)rs,(void *)(ulong)(uint)readFrom,0x82);
    uVar2 = local_1c8._8_8_;
    uVar1 = local_1c8._0_8_;
    if (local_1c8._8_8_ == local_1c8._0_8_) {
      readFrom = readFrom + 0x82;
    }
    else {
      __last = (uchar *)(local_1c8._0_8_ + 8);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)local_1c8._0_8_,__last,&local_198.Checksum);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last,(uchar *)(uVar1 + 0x18),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.VolumeId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x18),(uchar *)(uVar1 + 0x28),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.ObjectId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x28),(uchar *)(uVar1 + 0x38),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.BirthVolumeId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x38),(uchar *)(uVar1 + 0x48),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.BirthObjectId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x48),(uchar *)(uVar1 + 0x58),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.NetBIOSName);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x58),(uchar *)(uVar1 + 0x5c),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x5c),(uchar *)(uVar1 + 100),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved1);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 100),(uchar *)(uVar1 + 0x6c),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.MSFileTime);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x6c),(uchar *)(uVar1 + 0x70),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryPinStatus);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x70),(uchar *)(uVar1 + 0x74),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved2);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x74),(uchar *)(uVar1 + 0x78),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.AccessedCount);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x78),(uchar *)(uVar1 + 0x80),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved3);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)(uVar1 + 0x80),(uchar *)(uVar1 + 0x82),
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.LengthOfUnicodeData);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_198.LengthOfUnicodeData.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_198.LengthOfUnicodeData.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0,
                 &local_198.LengthOfUnicodeData);
      iVar4 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1b0);
      ReadStream::read((ReadStream *)local_1e0,(int)rs,(void *)(ulong)(readFrom + 0x86U),
                       (ulong)(uint)(iVar4 * 2));
      this_00 = (DestListEntryArray *)local_1e0._0_8_;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)local_1e0._0_8_,(uchar *)local_1e0._8_8_,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryStringData);
      reverseAllFields(this_00,&local_198);
      std::
      vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
      ::push_back(&this->destListEntryArray,&local_198);
      readFrom = readFrom + 0x86U + iVar4 * 2;
      uVar3 = uVar3 - 1;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    DestListEntry::~DestListEntry(&local_198);
  } while (uVar2 != uVar1);
  return;
}

Assistant:

void DestListEntryArray::fillDestListEntryArray(ReadStream *rs, int readFrom, DestListHeader header) {
    int count = header.getTotalNumberOfCurrentEntries();
    int tmpReadFrom = readFrom;

    while(count > 0) {
        DestListEntry tmpDestListEntry;

        std::vector<unsigned char> firstPartOfEntry = rs->read(tmpReadFrom,130);
        tmpReadFrom = 130 + tmpReadFrom;
        auto it = firstPartOfEntry.begin();

       if(firstPartOfEntry.size() != 0) {
            std::copy(it, it + 8, std::back_inserter(tmpDestListEntry.Checksum));
            it += 8;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.VolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.ObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.BirthVolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.BirthObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.NetBIOSName));
            it += 16;
            std::copy(it, it + 4, std::back_inserter(tmpDestListEntry.EntryId));
            tmpReadFrom = 4 + tmpReadFrom;
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved1));
            it += 8;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.MSFileTime));
            it += 8;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.EntryPinStatus));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.Reserved2));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.AccessedCount));
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved3));
            it += 8;
            std::copy(it, it + 2, std::back_inserter(tmpDestListEntry.LengthOfUnicodeData));
            reverse(tmpDestListEntry.LengthOfUnicodeData.begin(), tmpDestListEntry.LengthOfUnicodeData.end());
            int len = Utils::lenTwoBytes(tmpDestListEntry.LengthOfUnicodeData);
            len *= 2; // Because it is unicode characters
            std::vector<unsigned char> entryStringData =  rs->read(tmpReadFrom, len);
            std::copy(entryStringData.begin(), entryStringData.end(), std::back_inserter(tmpDestListEntry.EntryStringData));
            tmpReadFrom = len + tmpReadFrom;
            DestListEntryArray::reverseAllFields(&tmpDestListEntry);
            destListEntryArray.push_back(tmpDestListEntry);
            --count;
        } else break;
    }
}